

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  byte bVar1;
  Vdbe *p;
  ExprList *pEVar2;
  int p2;
  int addr;
  uint uVar3;
  int iVar4;
  AggInfo_func *pAVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  p = pParse->pVdbe;
  pAVar5 = pAggInfo->aFunc;
  iVar7 = 0;
  while ((iVar7 < pAggInfo->nFunc && (pParse->nErr == 0))) {
    pEVar2 = (pAVar5->pFExpr->x).pList;
    if (-1 < pAVar5->iOBTab) {
      iVar4 = pEVar2->nExpr;
      p2 = sqlite3GetTempRange(pParse,iVar4);
      if (pAVar5->bOBPayload == '\0') {
        iVar6 = 0;
      }
      else {
        iVar6 = ((pAVar5->pFExpr->pLeft->x).pList)->nExpr + (uint)(pAVar5->bOBUnique == '\0');
      }
      addr = sqlite3VdbeAddOp1(p,0x24,pAVar5->iOBTab);
      iVar8 = iVar4 + -1;
      for (iVar9 = iVar8; -1 < iVar9; iVar9 = iVar9 + -1) {
        sqlite3VdbeAddOp3(p,0x5e,pAVar5->iOBTab,iVar9 + iVar6,iVar9 + p2);
      }
      if (pAVar5->bUseSubtype != '\0') {
        iVar9 = sqlite3GetTempReg(pParse);
        uVar3 = 0;
        if (pAVar5->bOBPayload == '\0') {
          uVar3 = (uint)(pAVar5->bOBUnique == '\0');
        }
        iVar6 = uVar3 + iVar6 + iVar4 * 2;
        for (; iVar6 = iVar6 + -1, -1 < iVar8; iVar8 = iVar8 + -1) {
          sqlite3VdbeAddOp3(p,0x5e,pAVar5->iOBTab,iVar6,iVar9);
          sqlite3VdbeAddOp2(p,0xb6,iVar9,iVar8 + p2);
        }
        if (iVar9 != 0) {
          bVar1 = pParse->nTempReg;
          if ((ulong)bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            pParse->aTempReg[bVar1] = iVar9;
          }
        }
      }
      sqlite3VdbeAddOp3(p,0xa2,0,p2,pAggInfo->iFirstReg + iVar7 + pAggInfo->nColumn);
      sqlite3VdbeAppendP4(p,pAVar5->pFunc,-7);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (u16)iVar4;
      }
      sqlite3VdbeAddOp2(p,0x27,pAVar5->iOBTab,addr + 1);
      sqlite3VdbeJumpHere(p,addr);
      sqlite3ReleaseTempRange(pParse,p2,iVar4);
    }
    if (pEVar2 == (ExprList *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = pEVar2->nExpr;
    }
    sqlite3VdbeAddOp2(p,0xa5,pAggInfo->iFirstReg + iVar7 + pAggInfo->nColumn,iVar4);
    sqlite3VdbeAppendP4(p,pAVar5->pFunc,-7);
    iVar7 = iVar7 + 1;
    pAVar5 = pAVar5 + 1;
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    if( pParse->nErr ) return;
    pList = pF->pFExpr->x.pList;
    if( pF->iOBTab>=0 ){
      /* For an ORDER BY aggregate, calls to OP_AggStep were deferred.  Inputs
      ** were stored in emphermal table pF->iOBTab.  Here, we extract those
      ** inputs (in ORDER BY order) and make all calls to OP_AggStep
      ** before doing the OP_AggFinal call. */
      int iTop;        /* Start of loop for extracting columns */
      int nArg;        /* Number of columns to extract */
      int nKey;        /* Key columns to be skipped */
      int regAgg;      /* Extract into this array */
      int j;           /* Loop counter */

      assert( pF->pFunc!=0 );
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);

      if( pF->bOBPayload==0 ){
        nKey = 0;
      }else{
        assert( pF->pFExpr->pLeft!=0 );
        assert( ExprUseXList(pF->pFExpr->pLeft) );
        assert( pF->pFExpr->pLeft->x.pList!=0 );
        nKey = pF->pFExpr->pLeft->x.pList->nExpr;
        if( ALWAYS(!pF->bOBUnique) ) nKey++;
      }
      iTop = sqlite3VdbeAddOp1(v, OP_Rewind, pF->iOBTab); VdbeCoverage(v);
      for(j=nArg-1; j>=0; j--){
        sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, nKey+j, regAgg+j);
      }
      if( pF->bUseSubtype ){
        int regSubtype = sqlite3GetTempReg(pParse);
        int iBaseCol = nKey + nArg + (pF->bOBPayload==0 && pF->bOBUnique==0);
        for(j=nArg-1; j>=0; j--){
          sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, iBaseCol+j, regSubtype);
          sqlite3VdbeAddOp2(v, OP_SetSubtype, regSubtype, regAgg+j);
        }
        sqlite3ReleaseTempReg(pParse, regSubtype);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3VdbeAddOp2(v, OP_Next, pF->iOBTab, iTop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, iTop);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    sqlite3VdbeAddOp2(v, OP_AggFinal, AggInfoFuncReg(pAggInfo,i),
                      pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}